

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascDecrypt.cpp
# Opt level: O1

int CascDecrypt(TCascStorage *hs,LPBYTE pbOutBuffer,PDWORD pcbOutBuffer,LPBYTE pbInBuffer,
               DWORD cbInBuffer,DWORD dwFrameIndex)

{
  byte bVar1;
  BYTE BVar2;
  void *pvVar3;
  long lVar4;
  ulong __n;
  ulong __n_00;
  byte *__dest;
  LPBYTE pBVar5;
  uint uVar6;
  LPBYTE pBVar7;
  size_t cbInBuffer_00;
  ULONGLONG KeyName;
  BYTE Vector [8];
  undefined8 local_50;
  LPBYTE local_48;
  byte local_40 [8];
  undefined8 local_38;
  
  local_50 = 0;
  if (cbInBuffer == 0) {
    return 0x3ec;
  }
  __n = (ulong)*pbInBuffer;
  if ((*pbInBuffer & 0xf7) == 0) {
    pBVar7 = pbInBuffer + cbInBuffer;
    pBVar5 = pbInBuffer + __n + 1;
    if (pBVar7 <= pBVar5) {
      return 0x3ec;
    }
    local_48 = pbOutBuffer;
    memcpy(&local_50,pbInBuffer + 1,__n);
    bVar1 = (pbInBuffer + 1)[__n];
    __n_00 = (ulong)bVar1;
    if ((bVar1 == 8) || (bVar1 == 4)) {
      if (pBVar7 <= pBVar5 + __n_00 + 1) {
        return 0x3ec;
      }
      __dest = local_40;
      local_40[0] = 0;
      local_40[1] = 0;
      local_40[2] = 0;
      local_40[3] = 0;
      local_40[4] = 0;
      local_40[5] = 0;
      local_40[6] = 0;
      local_40[7] = 0;
      memcpy(__dest,pbInBuffer + __n + 2,__n_00);
      BVar2 = (pbInBuffer + __n + 2)[__n_00];
      if ((BVar2 != 'S') && (BVar2 != 'A')) {
        return 0x5f;
      }
      cbInBuffer_00 = (long)pBVar7 - (long)(pBVar5 + __n_00 + 2);
      uVar6 = (uint)cbInBuffer_00;
      if (*pcbOutBuffer < uVar6) {
        return 0x69;
      }
      local_38 = local_50;
      pvVar3 = Map_FindObject(hs->pEncryptionKeys,&local_38,(PDWORD)0x0);
      if (pvVar3 != (void *)0x0) {
        lVar4 = 0;
        do {
          *__dest = *__dest ^ (byte)(dwFrameIndex >> ((byte)lVar4 & 0x1f));
          lVar4 = lVar4 + 8;
          __dest = __dest + 1;
        } while (lVar4 != 0x20);
        if (BVar2 == 'S') {
          Decrypt_Salsa20(local_48,pBVar5 + __n_00 + 2,cbInBuffer_00,(LPBYTE)((long)pvVar3 + 8),
                          (DWORD)local_40,(LPBYTE)((long)pvVar3 + 8));
          *pcbOutBuffer = uVar6;
          return 0;
        }
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/CascDecrypt.cpp"
                      ,0x1a9,"int CascDecrypt(TCascStorage *, LPBYTE, PDWORD, LPBYTE, DWORD, DWORD)"
                     );
      }
      return 0x3ed;
    }
  }
  return 0x5f;
}

Assistant:

int CascDecrypt(TCascStorage * hs, LPBYTE pbOutBuffer, PDWORD pcbOutBuffer, LPBYTE pbInBuffer, DWORD cbInBuffer, DWORD dwFrameIndex)
{
    ULONGLONG KeyName = 0;
    LPBYTE pbBufferEnd = pbInBuffer + cbInBuffer;
    LPBYTE pbKey;
    DWORD KeyNameSize;
    DWORD dwShift = 0;
    DWORD IVSize;
    BYTE Vector[0x08];
    BYTE EncryptionType;
    int nError;

    // Verify and retrieve the key name size
    if(pbInBuffer >= pbBufferEnd)
        return ERROR_FILE_CORRUPT;
    if(pbInBuffer[0] != 0 && pbInBuffer[0] != 8)
        return ERROR_NOT_SUPPORTED;
    KeyNameSize = *pbInBuffer++;

    // Copy the key name
    if((pbInBuffer + KeyNameSize) >= pbBufferEnd)
        return ERROR_FILE_CORRUPT;
    memcpy(&KeyName, pbInBuffer, KeyNameSize);
    pbInBuffer += KeyNameSize;

    // Verify and retrieve the Vector size
    if(pbInBuffer >= pbBufferEnd)
        return ERROR_FILE_CORRUPT;
    if(pbInBuffer[0] != 4 && pbInBuffer[0] != 8)
        return ERROR_NOT_SUPPORTED;
    IVSize = *pbInBuffer++;

    // Copy the initialization vector
    if((pbInBuffer + IVSize) >= pbBufferEnd)
        return ERROR_FILE_CORRUPT;
    memset(Vector, 0, sizeof(Vector));
    memcpy(Vector, pbInBuffer, IVSize);
    pbInBuffer += IVSize;

    // Verify and retrieve the encryption type
    if(pbInBuffer >= pbBufferEnd)
        return ERROR_FILE_CORRUPT;
    if(pbInBuffer[0] != 'S' && pbInBuffer[0] != 'A')
        return ERROR_NOT_SUPPORTED;
    EncryptionType = *pbInBuffer++;

    // Do we have enough space in the output buffer?
    if((DWORD)(pbBufferEnd - pbInBuffer) > pcbOutBuffer[0])
        return ERROR_INSUFFICIENT_BUFFER;

    // Check if we know the key
    pbKey = CascFindKey(hs, KeyName);
    if(pbKey == NULL)
        return ERROR_FILE_ENCRYPTED;

    // Shuffle the Vector with the block index
    // Note that there's no point to go beyond 32 bits, unless the file has
    // more than 0xFFFFFFFF frames.
    for(size_t i = 0; i < sizeof(dwFrameIndex); i++)
    {
        Vector[i] = Vector[i] ^ (BYTE)((dwFrameIndex >> dwShift) & 0xFF);
        dwShift += 8;
    }

    // Perform the decryption-specific action
    switch(EncryptionType)
    {
        case 'S':   // Salsa20
            nError = Decrypt_Salsa20(pbOutBuffer, pbInBuffer, (pbBufferEnd - pbInBuffer), pbKey, 0x10, Vector);
            if(nError != ERROR_SUCCESS)
                return nError;

            // Supply the size of the output buffer
            pcbOutBuffer[0] = (DWORD)(pbBufferEnd - pbInBuffer);
            return ERROR_SUCCESS;

//      case 'A':   
//          return ERROR_NOT_SUPPORTED;
    }

    assert(false);
    return ERROR_NOT_SUPPORTED;
}